

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTimeAccess.cpp
# Opt level: O1

long __thiscall bhf::ads::RTimeAccess::SetSharedCores(RTimeAccess *this,uint32_t sharedCores)

{
  long lVar1;
  AmsAddr systemService;
  RTimeCpuSettings oldSettings;
  uint32_t local_3c;
  AmsAddr local_38;
  RTimeCpuSettings local_30;
  
  local_3c = sharedCores;
  ReadCpuSettings(&local_30,this);
  if (local_3c == 0xffffffff) {
    if (local_30.nNonWinCPUs != 0) goto LAB_0011d91c;
  }
  else if (local_3c != local_30.nWinCPUs) {
LAB_0011d91c:
    local_38.netId.b._4_2_ = *(undefined2 *)((this->device).m_Addr.netId.b + 4);
    local_38.netId.b._0_4_ = *(undefined4 *)(this->device).m_Addr.netId.b;
    local_38.port = 10000;
    lVar1 = AdsDevice::GetLocalPort(&this->device);
    lVar1 = AdsSyncWriteReqEx(lVar1,&local_38,0x4b0,0,4,&local_3c);
    return lVar1;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "Requested shared core configuration already active, no change applied.\n",0x47);
  return 0x70f;
}

Assistant:

long RTimeAccess::SetSharedCores(const uint32_t sharedCores) const
{
    const auto oldSettings = ReadCpuSettings();

    if (sharedCores == std::numeric_limits<uint32_t>::max()) {
        // 0xffffffff means RESET -> no isolated cores, all shared.
        if (0 == oldSettings.nNonWinCPUs) {
            std::cout << "Requested shared core configuration already active, no change applied.\n";
            return ADSERR_DEVICE_EXISTS;
        }
    } else {
        // All other values mean limit the number of shared cores -> use remaining cores as isolated.
        if (sharedCores == oldSettings.nWinCPUs) {
            std::cout << "Requested shared core configuration already active, no change applied.\n";
            return ADSERR_DEVICE_EXISTS;
        }
    }
    // We have to apply changes to the current core configuration. For this we
    // have to talk to a different AdsDevice, the system service. Now, it is handy
    // that ADS doesn't really implement "connections" so we can just use the AMS
    // port of our RTimeAccess object, but adust the target AmsPort.
    const AmsAddr systemService { device.m_Addr.netId, 10000 };
    return AdsSyncWriteReqEx(device.GetLocalPort(),
                             &systemService,
                             SYSTEMSERVICE_SETNUMPROC,
                             0,
                             sizeof(sharedCores),
                             &sharedCores);
}